

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-netpack.c
# Opt level: O3

int lpop(lua_State *L)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  
  piVar2 = (int *)lua_touserdata(L,1);
  iVar3 = 0;
  if (piVar2 != (int *)0x0) {
    iVar1 = piVar2[1];
    lVar4 = (long)iVar1;
    iVar3 = 0;
    if (iVar1 != piVar2[2]) {
      iVar3 = 0;
      if (iVar1 + 1 < *piVar2) {
        iVar3 = iVar1 + 1;
      }
      piVar2[1] = iVar3;
      lua_pushinteger(L,(long)piVar2[lVar4 * 4 + 0x2004]);
      lua_pushlightuserdata(L,*(void **)(piVar2 + lVar4 * 4 + 0x2006));
      lua_pushinteger(L,(long)piVar2[lVar4 * 4 + 0x2005]);
      iVar3 = 3;
    }
  }
  return iVar3;
}

Assistant:

static int
lpop(lua_State *L) {
	struct queue * q = lua_touserdata(L, 1);
	if (q == NULL || q->head == q->tail)
		return 0;
	struct netpack *np = &q->queue[q->head];
	if (++q->head >= q->cap) {
		q->head = 0;
	}
	lua_pushinteger(L, np->id);
	lua_pushlightuserdata(L, np->buffer);
	lua_pushinteger(L, np->size);

	return 3;
}